

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

int * __thiscall
google::protobuf::internal::ExtensionSet::GetRefRepeatedEnum
          (ExtensionSet *this,int number,int index)

{
  Extension *pEVar1;
  const_reference piVar2;
  string_view str;
  LogMessage LStack_18;
  
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x206,"extension != nullptr");
    str._M_str = "Index out-of-bounds (field is empty).";
    str._M_len = 0x25;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&LStack_18,str)
    ;
    goto LAB_0023b58f;
  }
  if (pEVar1->is_repeated == false) {
    GetRefRepeatedEnum();
LAB_0023b57f:
    GetRefRepeatedEnum();
  }
  else {
    if ((byte)(pEVar1->type - 0x13) < 0xee) goto LAB_0023b57f;
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4) == 8) {
      piVar2 = RepeatedField<int>::Get((RepeatedField<int> *)pEVar1->field_0,index);
      return piVar2;
    }
  }
  GetRefRepeatedEnum();
LAB_0023b58f:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_18)
  ;
}

Assistant:

const int& ExtensionSet::GetRefRepeatedEnum(int number, int index) const {
  const Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
  return extension->ptr.repeated_enum_value->Get(index);
}